

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkLibrariesCommand.h
# Opt level: O0

cmCommand * __thiscall cmLinkLibrariesCommand::Clone(cmLinkLibrariesCommand *this)

{
  cmCommand *this_00;
  cmLinkLibrariesCommand *this_local;
  
  this_00 = (cmCommand *)operator_new(0x30);
  cmLinkLibrariesCommand((cmLinkLibrariesCommand *)this_00);
  return this_00;
}

Assistant:

cmCommand* Clone() override { return new cmLinkLibrariesCommand; }